

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

classification mjs::anon_unknown_2::classify(uint32_t ch)

{
  bool bVar1;
  uint uVar2;
  classification cVar3;
  runtime_error *this;
  uint32_t low;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  if (0xe01ef < ch) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unicode character out of range");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar3 = id_part;
  if (ch != 0xe01ef) {
    iVar6 = 0x51d;
    uVar4 = 0;
    do {
      uVar5 = (iVar6 - uVar4 >> 1) + uVar4;
      if (ch < *(uint *)(unicode::classification_run_start + (ulong)uVar5 * 4)) {
        iVar6 = uVar5 - 1;
        bVar1 = true;
        uVar2 = uVar4;
      }
      else {
        bVar1 = true;
        uVar2 = uVar5 + 1;
        if (ch < *(uint *)(unicode::classification_run_start + (ulong)(uVar5 + 1) * 4)) {
          cVar3 = unicode::classification_run_type[uVar5];
          bVar1 = false;
          uVar2 = uVar4;
        }
      }
      uVar4 = uVar2;
    } while (bVar1);
  }
  return cVar3;
}

Assistant:

constexpr unicode::classification classify(const uint32_t ch) {
    constexpr auto asize = static_cast<int>(sizeof(unicode::classification_run_start)/sizeof(*unicode::classification_run_start));
    if (ch > unicode::classification_run_start[asize-1]) {
        throw std::runtime_error("Unicode character out of range");
    } else if (ch == unicode::classification_run_start[asize-1]) {
        // Very unlikely
        return unicode::classification_run_type[asize-1];
    }    
    for (uint32_t low = 0, high = asize-1;;) {
        const uint32_t index = low + (high-low) / 2;
        if (ch < unicode::classification_run_start[index]) {
            high = index - 1;
        } else if (ch >= unicode::classification_run_start[index+1]) {
            low = index + 1;
        } else {
            return unicode::classification_run_type[index];
        }
    }
}